

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O0

void kat::GetRowORD(map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                    *data_plt,fin_data *row)

{
  period_event __src;
  mapped_type *__dest;
  undefined1 local_24 [4];
  float periodWeight;
  period_event periodEventID;
  fin_data *row_local;
  map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
  *data_plt_local;
  
  periodEventID = (period_event)row;
  __isoc99_sscanf(row->data,"%d,%f,%d",&stack0xffffffffffffffe0,local_24,&periodWeight);
  __src = periodEventID;
  __dest = std::
           map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
           ::operator[](data_plt,(key_type *)&stack0xffffffffffffffe0);
  memcpy(__dest,(void *)__src,0x1008);
  return;
}

Assistant:

void GetRowORD(std::map<period_event, fin_data> &data_plt,
		       const fin_data &row) {
		// Sort by period number and then event number
		period_event periodEventID;
		float periodWeight;   // Not used but needs to be read in
		sscanf(row.data, "%d,%f,%d", &periodEventID.period,
		       &periodWeight, &periodEventID.eventID);
		data_plt[periodEventID] = row;
	}